

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_socket.c
# Opt level: O1

ares_bool_t ares_sockaddr_to_ares_addr(ares_addr *ares_addr,unsigned_short *port,sockaddr *sockaddr)

{
  ushort uVar1;
  in_addr_t iVar2;
  undefined4 uVar3;
  ares_bool_t aVar4;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  if (sockaddr->sa_family == 10) {
    uVar1 = *(ushort *)sockaddr->sa_data;
    uVar3 = *(undefined4 *)(sockaddr[1].sa_data + 2);
    uStack_14 = (undefined4)((ulong)*(undefined8 *)(sockaddr->sa_data + 2) >> 0x20);
    uStack_10 = (undefined4)*(undefined8 *)(sockaddr->sa_data + 10);
    uStack_c = (undefined4)((ulong)*(undefined8 *)(sockaddr->sa_data + 10) >> 0x20);
    ares_addr->family = 10;
    *(ulong *)&ares_addr->addr = CONCAT44(uStack_10,uStack_14);
    *(undefined4 *)((long)&ares_addr->addr + 8) = uStack_c;
    *(undefined4 *)((long)&ares_addr->addr + 0xc) = uVar3;
    if (port != (unsigned_short *)0x0) {
      *port = uVar1 << 8 | uVar1 >> 8;
    }
    aVar4 = ARES_TRUE;
  }
  else {
    aVar4 = ARES_FALSE;
    if (sockaddr->sa_family == 2) {
      uVar1 = *(ushort *)sockaddr->sa_data;
      iVar2 = *(in_addr_t *)(sockaddr->sa_data + 2);
      ares_addr->family = 2;
      (ares_addr->addr).addr4.s_addr = iVar2;
      aVar4 = ARES_TRUE;
      if (port != (unsigned_short *)0x0) {
        *port = uVar1 << 8 | uVar1 >> 8;
        return ARES_TRUE;
      }
    }
  }
  return aVar4;
}

Assistant:

ares_bool_t ares_sockaddr_to_ares_addr(struct ares_addr      *ares_addr,
                                       unsigned short        *port,
                                       const struct sockaddr *sockaddr)
{
  if (sockaddr->sa_family == AF_INET) {
    /* NOTE: memcpy sockaddr_in due to alignment issues found by UBSAN due to
     *       dnsinfo packing on MacOS */
    struct sockaddr_in sockaddr_in;
    memcpy(&sockaddr_in, sockaddr, sizeof(sockaddr_in));

    ares_addr->family = AF_INET;
    memcpy(&ares_addr->addr.addr4, &(sockaddr_in.sin_addr),
           sizeof(ares_addr->addr.addr4));

    if (port) {
      *port = ntohs(sockaddr_in.sin_port);
    }
    return ARES_TRUE;
  }

  if (sockaddr->sa_family == AF_INET6) {
    /* NOTE: memcpy sockaddr_in6 due to alignment issues found by UBSAN due to
     *       dnsinfo packing on MacOS */
    struct sockaddr_in6 sockaddr_in6;
    memcpy(&sockaddr_in6, sockaddr, sizeof(sockaddr_in6));

    ares_addr->family = AF_INET6;
    memcpy(&ares_addr->addr.addr6, &(sockaddr_in6.sin6_addr),
           sizeof(ares_addr->addr.addr6));
    if (port) {
      *port = ntohs(sockaddr_in6.sin6_port);
    }
    return ARES_TRUE;
  }

  return ARES_FALSE;
}